

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::resize(raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         *this,size_t new_capacity)

{
  ctrl_t *p;
  slot_type *pptVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  ctrl_t *__s;
  size_t sVar3;
  ulong uVar4;
  Layout LVar5;
  FindInfo FVar6;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int>>, Hash, Eq, std::allocator<std::unique_ptr<int>>>::resize(size_t) [Policy = phmap::priv::NodeHashSetPolicy<std::unique_ptr<int>>, Hash = Hash, Eq = Eq, Alloc = std::allocator<std::unique_ptr<int>>]"
                 );
  }
  p = this->ctrl_;
  pptVar1 = this->slots_;
  capacity = this->capacity_;
  LVar5 = MakeLayout(new_capacity);
  uVar4 = LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_std::unique_ptr<int>_*>.size_[0] + 7 &
          0xfffffffffffffff8;
  __s = (ctrl_t *)
        Allocate<8ul,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                  ((allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *)&this->settings_,
                   LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_std::unique_ptr<int>_*>.size_
                   [1] * 8 + uVar4);
  if (((ulong)__s & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<signed char, std::unique_ptr<int> *>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, std::unique_ptr<int> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = char]"
                 );
  }
  this->ctrl_ = __s;
  this->slots_ = (slot_type *)(__s + uVar4);
  memset(__s,0x80,new_capacity + 0x10);
  this->ctrl_[new_capacity] = -1;
  reset_growth_left(this,new_capacity);
  this->capacity_ = new_capacity;
  if (capacity != 0) {
    sVar3 = 0;
    do {
      if (-1 < p[sVar3]) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)*(pptVar1[sVar3]->_M_t).
                              super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl;
        FVar6 = find_first_non_full((raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                                     *)this->ctrl_,this->capacity_);
        set_ctrl(this,FVar6.offset,
                 SUB161(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB161(auVar2 * ZEXT816(0xde5fb9d2630458e9),0) & 0x7f);
        this->slots_[FVar6.offset] = pptVar1[sVar3];
      }
      sVar3 = sVar3 + 1;
    } while (capacity != sVar3);
    LVar5 = MakeLayout(capacity);
    Deallocate<8ul,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
              ((allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *)&this->settings_,p,
               (LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_std::unique_ptr<int>_*>.size_[0]
                + 7 & 0xfffffffffffffff8) +
               LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_std::unique_ptr<int>_*>.size_[1] *
               8);
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }